

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

ValueType __thiscall ValueType::Merge(ValueType *this,Var var)

{
  code *pcVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  RecyclableObject *recyclableObject;
  Bits bits;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *this_00;
  undefined8 local_38;
  ValueType merged;
  ValueType merged_1;
  ValueType merged_2;
  
  local_38 = in_RAX;
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x44d,"(var)","var");
    if (!bVar2) goto LAB_00b224c5;
    *puVar4 = 0;
  }
  if (((ulong)var & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)var & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00b224c5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (((ulong)var & 0xffff000000000000) == 0x1000000000000) {
    Verify(*(ValueType *)&(this->field_0).field_0);
    if ((this->field_0).field_0 ==
        (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)0x28) {
      return (ValueType)(anon_union_2_4_ea848c7b_for_ValueType_13)0x28;
    }
    ValueType((ValueType *)((long)&local_38 + 2),
              (ushort)(this->field_0).field_0 | (Int|CanBeTaggedValue));
    if ((local_38._2_2_ & Object) == 0) {
LAB_00b2249b:
      Verify((ValueType)local_38._2_2_);
      return (ValueType)local_38._2_2_;
    }
    valueType.bits = Int|CanBeTaggedValue;
  }
  else {
    if ((ulong)var >> 0x32 == 0) {
      recyclableObject = Js::UnsafeVarTo<Js::RecyclableObject>(var);
      valueType.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           FromObject(recyclableObject);
      Verify(*(ValueType *)&(this->field_0).field_0);
      Verify((ValueType)valueType);
      aVar3.field_0 = (this->field_0).field_0;
      if (aVar3.bits == valueType.bits) {
        return (ValueType)aVar3;
      }
      bits = aVar3.bits | valueType.bits;
      this_00 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                ((long)&local_38 + 6);
    }
    else {
      valueType.bits = Float|CanBeTaggedValue;
      if (((this->field_0).bits & ~CanBeTaggedValue) == Likely ||
          ((this->field_0).bits &
          ~(Number|IntIsLikelyUntagged|IntCanBeUntagged|CanBeTaggedValue|Likely)) == Int) {
        bVar2 = Js::JavascriptNumber::IsInt32_NoChecks(var);
        if (bVar2) {
          ValueType((ValueType *)&local_38,IntIsLikelyUntagged|IntCanBeUntagged|Int|CanBeTaggedValue
                   );
          Verify((ValueType)local_38._0_2_);
          valueType = local_38._0_2_;
        }
      }
      Verify(*(ValueType *)&(this->field_0).field_0);
      Verify((ValueType)valueType.field_0);
      aVar3.field_0 = (this->field_0).field_0;
      if (aVar3.bits == valueType.bits) {
        return (ValueType)aVar3;
      }
      bits = aVar3.bits | valueType.bits;
      this_00 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                ((long)&local_38 + 4);
    }
    ValueType((ValueType *)this_00,bits);
    local_38._2_2_ = *this_00;
    if ((local_38._2_2_ & Object) == 0) goto LAB_00b2249b;
  }
  aVar3.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       MergeWithObject(this,valueType.field_0);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar3.field_0;
}

Assistant:

ValueType ValueType::Merge(const Js::Var var) const
{
    using namespace Js;
    Assert(var);

    if(TaggedInt::Is(var))
        return Merge(GetTaggedInt());
    if(JavascriptNumber::Is_NoTaggedIntCheck(var))
    {
        return
            Merge(
                (IsUninitialized() || IsLikelyInt()) && JavascriptNumber::IsInt32_NoChecks(var)
                    ? GetInt(false)
                    : ValueType::Float);
    }
    return Merge(FromObject(UnsafeVarTo<RecyclableObject>(var)));
}